

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

int __thiscall QWidget::heightForWidth(QWidget *this,int w)

{
  uint uVar1;
  int iVar2;
  QLayout *pQVar3;
  int in_stack_0000000c;
  undefined4 in_stack_00000010;
  
  pQVar3 = layout((QWidget *)0x37db50);
  if (pQVar3 != (QLayout *)0x0) {
    pQVar3 = layout((QWidget *)0x37db60);
    uVar1 = (*(pQVar3->super_QLayoutItem)._vptr_QLayoutItem[9])(&pQVar3->super_QLayoutItem);
    if ((uVar1 & 1) != 0) {
      layout((QWidget *)0x37db7e);
      iVar2 = QLayout::totalHeightForWidth
                        ((QLayout *)CONCAT44(w,in_stack_00000010),in_stack_0000000c);
      return iVar2;
    }
  }
  return -1;
}

Assistant:

int QWidget::heightForWidth(int w) const
{
    if (layout() && layout()->hasHeightForWidth())
        return layout()->totalHeightForWidth(w);
    return -1;
}